

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

size_t ma_dr_wav__on_write_memory(void *pUserData,void *pDataIn,size_t bytesToWrite)

{
  size_t __n;
  long lVar1;
  void *__src;
  void *__dest;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  __n = *(size_t *)((long)pUserData + 0xf0);
  lVar1 = *(long *)((long)pUserData + 0xf8);
  if (__n - lVar1 < bytesToWrite) {
    lVar3 = 0x100;
    if (__n != 0) {
      lVar3 = __n * 2;
    }
    lVar4 = lVar1 + bytesToWrite;
    if (bytesToWrite <= (ulong)(lVar3 - lVar1)) {
      lVar4 = lVar3;
    }
    __src = (void *)**(undefined8 **)((long)pUserData + 0xd8);
    if (*(code **)((long)pUserData + 0x30) == (code *)0x0) {
      if ((*(code **)((long)pUserData + 0x28) == (code *)0x0) ||
         (*(long *)((long)pUserData + 0x38) == 0)) {
        __dest = (void *)0x0;
      }
      else {
        __dest = (void *)(**(code **)((long)pUserData + 0x28))
                                   (lVar4,*(undefined8 *)((long)pUserData + 0x20));
        if (__dest == (void *)0x0) {
          __dest = (void *)0x0;
        }
        else if (__src != (void *)0x0) {
          memcpy(__dest,__src,__n);
          (**(code **)((long)pUserData + 0x38))(__src,*(undefined8 *)((long)pUserData + 0x20));
        }
      }
    }
    else {
      __dest = (void *)(**(code **)((long)pUserData + 0x30))
                                 (__src,lVar4,*(undefined8 *)((long)pUserData + 0x20));
    }
    if (__dest == (void *)0x0) {
      return 0;
    }
    **(undefined8 **)((long)pUserData + 0xd8) = __dest;
    *(long *)((long)pUserData + 0xf0) = lVar4;
  }
  memcpy((void *)(**(long **)((long)pUserData + 0xd8) + *(long *)((long)pUserData + 0xf8)),pDataIn,
         bytesToWrite);
  uVar2 = *(long *)((long)pUserData + 0xf8) + bytesToWrite;
  *(ulong *)((long)pUserData + 0xf8) = uVar2;
  if (*(ulong *)((long)pUserData + 0xe8) < uVar2) {
    *(ulong *)((long)pUserData + 0xe8) = uVar2;
  }
  **(undefined8 **)((long)pUserData + 0xe0) = *(undefined8 *)((long)pUserData + 0xe8);
  return bytesToWrite;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__on_write_memory(void* pUserData, const void* pDataIn, size_t bytesToWrite)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    size_t bytesRemaining;
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(pWav->memoryStreamWrite.dataCapacity >= pWav->memoryStreamWrite.currentWritePos);
    bytesRemaining = pWav->memoryStreamWrite.dataCapacity - pWav->memoryStreamWrite.currentWritePos;
    if (bytesRemaining < bytesToWrite) {
        void* pNewData;
        size_t newDataCapacity = (pWav->memoryStreamWrite.dataCapacity == 0) ? 256 : pWav->memoryStreamWrite.dataCapacity * 2;
        if ((newDataCapacity - pWav->memoryStreamWrite.currentWritePos) < bytesToWrite) {
            newDataCapacity = pWav->memoryStreamWrite.currentWritePos + bytesToWrite;
        }
        pNewData = ma_dr_wav__realloc_from_callbacks(*pWav->memoryStreamWrite.ppData, newDataCapacity, pWav->memoryStreamWrite.dataCapacity, &pWav->allocationCallbacks);
        if (pNewData == NULL) {
            return 0;
        }
        *pWav->memoryStreamWrite.ppData = pNewData;
        pWav->memoryStreamWrite.dataCapacity = newDataCapacity;
    }
    MA_DR_WAV_COPY_MEMORY(((ma_uint8*)(*pWav->memoryStreamWrite.ppData)) + pWav->memoryStreamWrite.currentWritePos, pDataIn, bytesToWrite);
    pWav->memoryStreamWrite.currentWritePos += bytesToWrite;
    if (pWav->memoryStreamWrite.dataSize < pWav->memoryStreamWrite.currentWritePos) {
        pWav->memoryStreamWrite.dataSize = pWav->memoryStreamWrite.currentWritePos;
    }
    *pWav->memoryStreamWrite.pDataSize = pWav->memoryStreamWrite.dataSize;
    return bytesToWrite;
}